

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

bool __thiscall
miniros::RPCManager::bindEx(RPCManager *this,string *function_name,XMLRPCFuncEx *cb,void *object)

{
  bool bVar1;
  XMLRPCFuncEx *cb_00;
  mapped_type *this_00;
  _Base_ptr in_RSI;
  XMLRPCCallWrapperEx *in_RDI;
  FunctionInfo info;
  scoped_lock<std::mutex> lock;
  FunctionInfo *in_stack_fffffffffffffef8;
  FunctionInfo *in_stack_ffffffffffffff00;
  XmlRpcServer *s;
  string *function_name_00;
  key_type *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 local_68 [48];
  _Self local_38 [4];
  _Base_ptr local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff00,
             (mutex_type *)in_stack_fffffffffffffef8);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
               *)in_stack_fffffffffffffef8,(key_type *)0x497f71);
  local_68._24_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
              *)in_stack_fffffffffffffef8);
  bVar1 = std::operator!=(local_38,(_Self *)(local_68 + 0x18));
  if (bVar1) {
    local_1 = 0;
    local_68._20_4_ = 1;
  }
  else {
    function_name_00 = (string *)&stack0xffffffffffffff30;
    FunctionInfo::FunctionInfo(in_stack_ffffffffffffff00);
    std::__cxx11::string::operator=((string *)function_name_00,(string *)local_18);
    std::
    function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
    ::operator=((function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
                 *)in_RDI,
                (function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
                 *)function_name_00);
    s = (XmlRpcServer *)local_68;
    cb_00 = (XMLRPCFuncEx *)operator_new(0x50);
    XMLRPCCallWrapperEx::XMLRPCCallWrapperEx(in_RDI,function_name_00,cb_00,s);
    std::__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>::
    reset<miniros::XMLRPCCallWrapperEx>
              ((__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2> *)cb_00,
               (XMLRPCCallWrapperEx *)s);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
                            *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    FunctionInfo::operator=(this_00,in_stack_fffffffffffffef8);
    local_1 = 1;
    local_68._20_4_ = 1;
    FunctionInfo::~FunctionInfo(this_00);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x498127);
  return (bool)(local_1 & 1);
}

Assistant:

bool RPCManager::bindEx(const std::string& function_name, const XMLRPCFuncEx& cb, void* object)
{
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  if (functions_.find(function_name) != functions_.end())
  {
    return false;
  }

  FunctionInfo info;
  info.name = function_name;
  info.functionEx = cb;
  info.wrapper.reset(new XMLRPCCallWrapperEx(function_name, cb, &server_));
  info.object = object;
  functions_[function_name] = info;

  return true;
}